

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckLimits
          (SharedValidator *this,Location *loc,Limits *limits,uint64_t absolute_max,char *desc)

{
  Result RVar1;
  char *desc_local;
  uint64_t absolute_max_local;
  Limits *limits_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  if (absolute_max < limits->initial) {
    RVar1 = PrintError(this,loc,"initial %s (%lu) must be <= (%lu)",desc,limits->initial,
                       absolute_max);
    Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  }
  if ((limits->has_max & 1U) != 0) {
    if (absolute_max < limits->max) {
      RVar1 = PrintError(this,loc,"max %s (%lu) must be <= (%lu)",desc,limits->max,absolute_max);
      Result::operator|=((Result *)((long)&this_local + 4),RVar1);
    }
    if (limits->max < limits->initial) {
      RVar1 = PrintError(this,loc,"max %s (%lu) must be >= initial %s (%lu)",desc,limits->max,desc,
                         limits->initial);
      Result::operator|=((Result *)((long)&this_local + 4),RVar1);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckLimits(const Location& loc,
                                    const Limits& limits,
                                    uint64_t absolute_max,
                                    const char* desc) {
  Result result = Result::Ok;
  if (limits.initial > absolute_max) {
    result |=
        PrintError(loc, "initial %s (%" PRIu64 ") must be <= (%" PRIu64 ")",
                   desc, limits.initial, absolute_max);
  }

  if (limits.has_max) {
    if (limits.max > absolute_max) {
      result |= PrintError(loc, "max %s (%" PRIu64 ") must be <= (%" PRIu64 ")",
                           desc, limits.max, absolute_max);
    }

    if (limits.max < limits.initial) {
      result |= PrintError(
          loc, "max %s (%" PRIu64 ") must be >= initial %s (%" PRIu64 ")", desc,
          limits.max, desc, limits.initial);
    }
  }
  return result;
}